

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O3

MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  byte bVar1;
  RK_U8 RVar2;
  void *pvVar3;
  AcTable *pAVar4;
  DcTable *pDVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  undefined2 uVar9;
  uint uVar10;
  int iVar11;
  PpRgbCfg *pPVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  DcTable *pDVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  AcTable *pAVar24;
  void *__s;
  uint *puVar25;
  RK_U32 RVar26;
  
  if ((jpegd_debug & 1) == 0) {
    __s = ctx->regs;
  }
  else {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_gen_regs");
    __s = ctx->regs;
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_regs_init");
    }
  }
  uVar10 = 0;
  memset(__s,0,0x27c);
  *(undefined4 *)((long)__s + 0xd8) = 0x3e;
  *(undefined8 *)((long)__s + 0xe0) = 0x30001000ff;
  if ((jpegd_debug & 1) == 0) {
    uVar13 = 0x100;
    iVar11 = 0x31;
    uVar16 = 0;
    uVar15 = 0;
  }
  else {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_regs_init");
    uVar13 = *(uint *)((long)__s + 200) | 0x100;
    iVar11 = (*(uint *)((long)__s + 0xe4) & 0xffebfffa) + 1;
    uVar16 = *(uint *)((long)__s + 0x1e4) & 0xfbffffff;
    uVar15 = *(uint *)((long)__s + 0x1e0) & 0xfffffff8;
    uVar10 = *(uint *)((long)__s + 0x1e8) & 0xffffe7ff;
  }
  *(uint *)((long)__s + 200) = uVar13;
  *(undefined4 *)((long)__s + 0xd4) = 3;
  *(int *)((long)__s + 0xe4) = iVar11;
  uVar17 = syntax->ver_stride >> 0xc & 7;
  *(uint *)((long)__s + 0x1e0) = uVar17 | uVar15;
  uVar13 = syntax->hor_stride >> 10 & 0x38;
  *(uint *)((long)__s + 0x1e0) = uVar17 | uVar15 & 0xffffffc7 | uVar13;
  uVar14 = (syntax->hor_stride & 0xfffffff0) << 0x13;
  *(uint *)((long)__s + 0x1e0) = uVar17 | uVar15 & 0x7fffc7 | uVar13 | uVar14;
  *(uint *)((long)__s + 0x1e0) =
       uVar17 | uVar15 & 0x7807c7 | uVar13 | uVar14 | (syntax->ver_stride & 0xff0) << 7;
  uVar15 = (syntax->fill_bottom & 1) << 0x1a;
  *(uint *)((long)__s + 0x1e4) = uVar15 | uVar16;
  uVar16 = uVar15 | uVar16 & 0xffff00ff | (uint)syntax->scan_start << 8;
  *(uint *)((long)__s + 0x1e4) = uVar16;
  uVar16 = CONCAT31((int3)(uVar16 >> 8),syntax->scan_end);
  *(uint *)((long)__s + 0x1e4) = uVar16;
  uVar15 = (syntax->prev_shift & 0xf) << 0x14;
  *(uint *)((long)__s + 0x1e4) = uVar16 & 0xff0fffff | uVar15;
  *(uint *)((long)__s + 0x1e4) =
       uVar16 & 0xff00ffff | uVar15 | (syntax->point_transform & 0xf) << 0x10;
  uVar16 = (syntax->qtable_cnt & 3) << 0xb;
  *(uint *)((long)__s + 0x1e8) = uVar16 | uVar10;
  uVar15 = (syntax->yuv_mode & 7) << 8;
  *(uint *)((long)__s + 0x1e8) = uVar16 | uVar10 & 0xfffff8ff | uVar15;
  *(uint *)((long)__s + 0x1e8) =
       uVar16 | uVar10 & 0xfffff87f | uVar15 | (uint)(byte)(syntax->fill_right << 7);
  uVar10 = *(uint *)((long)__s + 0x250) & 0xffdfff00;
  *(uint *)((long)__s + 0x250) = uVar10 + 0x200000;
  if (((((syntax->height & 0xf) - 1 < 8) && ((ctx->pp_info).pp_enable == '\0')) &&
      (syntax->yuv_mode < 7)) && ((0x58U >> (syntax->yuv_mode & 0x1f) & 1) != 0)) {
    *(uint *)((long)__s + 0x250) = uVar10 | 0x300000;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_write_code_word_number");
  }
  pvVar3 = ctx->regs;
  pAVar24 = syntax->ac_table + 1;
  pAVar4 = syntax->ac_table;
  if (syntax->ac_index[0] == 0) {
    pAVar24 = syntax->ac_table;
    pAVar4 = syntax->ac_table + 1;
  }
  uVar16 = pAVar24->bits[0] & 3;
  uVar10 = *(uint *)((long)pvVar3 + 0x218);
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xfffffffc | uVar16;
  uVar10 = (uVar10 & 0xffffffc4 | uVar16) + (pAVar24->bits[1] & 7) * 8;
  *(uint *)((long)pvVar3 + 0x218) = uVar10;
  uVar16 = (pAVar24->bits[2] & 0xf) << 7;
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xfffff87f | uVar16;
  uVar15 = (pAVar24->bits[3] & 0x1f) << 0xb;
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xffff007f | uVar16 | uVar15;
  uVar13 = (pAVar24->bits[4] & 0x3f) << 0x10;
  *(uint *)((long)pvVar3 + 0x218) = uVar10 & 0xffc0007f | uVar16 | uVar15 | uVar13;
  *(uint *)((long)pvVar3 + 0x218) =
       uVar10 & 0x80c0007f | uVar16 | uVar15 | uVar13 | (pAVar24->bits[5] & 0x7f) << 0x18;
  bVar1 = (byte)pAVar24->bits[6];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x21c) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x21c) = uVar10;
  uVar16 = (pAVar24->bits[7] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x21c) = uVar10 & 0xffff00ff | uVar16;
  uVar15 = (pAVar24->bits[8] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x21c) = uVar10 & 0xff0000ff | uVar16 | uVar15;
  *(uint *)((long)pvVar3 + 0x21c) = bVar1 | uVar16 | uVar15 | pAVar24->bits[9] << 0x18;
  bVar1 = (byte)pAVar24->bits[10];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x220) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x220) = uVar10;
  uVar16 = (pAVar24->bits[0xb] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x220) = uVar10 & 0xffff00ff | uVar16;
  uVar15 = (pAVar24->bits[0xc] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x220) = uVar10 & 0xff0000ff | uVar16 | uVar15;
  *(uint *)((long)pvVar3 + 0x220) = bVar1 | uVar16 | uVar15 | pAVar24->bits[0xd] << 0x18;
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x224) >> 8),
                    (char)pAVar24->bits[0xe]);
  *(uint *)((long)pvVar3 + 0x224) = uVar10;
  uVar16 = (pAVar24->bits[0xf] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xffff00ff | uVar16;
  uVar15 = (pAVar4->bits[0] & 3) << 0x10;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xfffc00ff | uVar16 | uVar15;
  uVar13 = (pAVar4->bits[1] & 7) << 0x13;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xffc400ff | uVar16 | uVar15 | uVar13;
  uVar14 = (pAVar4->bits[2] & 0xf) << 0x17;
  *(uint *)((long)pvVar3 + 0x224) = uVar10 & 0xf84400ff | uVar16 | uVar15 | uVar13 | uVar14;
  *(uint *)((long)pvVar3 + 0x224) =
       uVar10 & 0x4400ff | uVar16 | uVar15 | uVar13 | uVar14 | pAVar4->bits[3] << 0x1b;
  uVar10 = *(uint *)((long)pvVar3 + 0x228);
  uVar16 = pAVar4->bits[4] & 0x3f;
  *(uint *)((long)pvVar3 + 0x228) = uVar10 & 0xffffffc0 | uVar16;
  uVar15 = (pAVar4->bits[5] & 0x7f) << 8;
  *(uint *)((long)pvVar3 + 0x228) = uVar10 & 0xffff80c0 | uVar16 | uVar15;
  uVar13 = (pAVar4->bits[6] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x228) = uVar10 & 0xff0080c0 | uVar16 | uVar15 | uVar13;
  *(uint *)((long)pvVar3 + 0x228) =
       uVar10 & 0x80c0 | uVar16 | uVar15 | uVar13 | pAVar4->bits[7] << 0x18;
  bVar1 = (byte)pAVar4->bits[8];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x22c) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x22c) = uVar10;
  uVar16 = (pAVar4->bits[9] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x22c) = uVar10 & 0xffff00ff | uVar16;
  uVar15 = (pAVar4->bits[10] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x22c) = uVar10 & 0xff0000ff | uVar16 | uVar15;
  *(uint *)((long)pvVar3 + 0x22c) = bVar1 | uVar16 | uVar15 | pAVar4->bits[0xb] << 0x18;
  bVar1 = (byte)pAVar4->bits[0xc];
  uVar10 = CONCAT31((int3)((uint)*(undefined4 *)((long)pvVar3 + 0x230) >> 8),bVar1);
  *(uint *)((long)pvVar3 + 0x230) = uVar10;
  uVar15 = (pAVar4->bits[0xd] & 0xff) << 8;
  *(uint *)((long)pvVar3 + 0x230) = uVar10 & 0xffff00ff | uVar15;
  uVar16 = (pAVar4->bits[0xe] & 0xff) << 0x10;
  *(uint *)((long)pvVar3 + 0x230) = uVar10 & 0xff0000ff | uVar15 | uVar16;
  *(uint *)((long)pvVar3 + 0x230) = bVar1 | uVar15 | uVar16 | pAVar4->bits[0xf] << 0x18;
  pDVar19 = syntax->dc_table;
  pDVar5 = syntax->dc_table + 1;
  if (syntax->dc_index[0] == 0) {
    pDVar19 = syntax->dc_table + 1;
    pDVar5 = syntax->dc_table;
  }
  uVar10 = *(uint *)((long)pvVar3 + 0x234);
  uVar16 = pDVar5->bits[0] & 3;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xfffffffc | uVar16;
  uVar15 = (pDVar5->bits[1] & 7) << 4;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xffffff8c | uVar16 | uVar15;
  uVar13 = (pDVar5->bits[2] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xfffff08c | uVar16 | uVar15 | uVar13;
  uVar14 = (pDVar5->bits[3] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xffff008c | uVar16 | uVar15 | uVar13 | uVar14;
  uVar17 = (pDVar5->bits[4] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x234) = uVar10 & 0xfff0008c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17
  ;
  uVar20 = (pDVar5->bits[5] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x234) =
       uVar10 & 0xff00008c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20;
  uVar21 = (pDVar5->bits[6] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x234) =
       uVar10 & 0xf000008c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20 | uVar21;
  *(uint *)((long)pvVar3 + 0x234) =
       uVar10 & 0x8c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20 | uVar21 |
       pDVar5->bits[7] << 0x1c;
  uVar10 = *(uint *)((long)pvVar3 + 0x238);
  uVar16 = pDVar5->bits[8] & 0xf;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xfffffff0 | uVar16;
  uVar15 = (pDVar5->bits[9] & 0xf) << 4;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xffffff00 | uVar16 | uVar15;
  uVar13 = (pDVar5->bits[10] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xfffff000 | uVar16 | uVar15 | uVar13;
  uVar14 = (pDVar5->bits[0xb] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xffff0000 | uVar16 | uVar15 | uVar13 | uVar14;
  uVar17 = (pDVar5->bits[0xc] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x238) = uVar10 & 0xfff00000 | uVar16 | uVar15 | uVar13 | uVar14 | uVar17
  ;
  uVar20 = (pDVar5->bits[0xd] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x238) =
       uVar10 & 0xff000000 | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20;
  uVar21 = (pDVar5->bits[0xe] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x238) =
       uVar10 & 0xf0000000 | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20 | uVar21;
  *(uint *)((long)pvVar3 + 0x238) =
       uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20 | uVar21 | pDVar5->bits[0xf] << 0x1c;
  uVar10 = *(uint *)((long)pvVar3 + 0x23c);
  uVar16 = pDVar19->bits[0] & 3;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xfffffffc | uVar16;
  uVar15 = (pDVar19->bits[1] & 7) << 4;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xffffff8c | uVar16 | uVar15;
  uVar13 = (pDVar19->bits[2] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xfffff08c | uVar16 | uVar15 | uVar13;
  uVar14 = (pDVar19->bits[3] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xffff008c | uVar16 | uVar15 | uVar13 | uVar14;
  uVar17 = (pDVar19->bits[4] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x23c) = uVar10 & 0xfff0008c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17
  ;
  uVar20 = (pDVar19->bits[5] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x23c) =
       uVar10 & 0xff00008c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20;
  uVar21 = (pDVar19->bits[6] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x23c) =
       uVar10 & 0xf000008c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20 | uVar21;
  *(uint *)((long)pvVar3 + 0x23c) =
       uVar10 & 0x8c | uVar16 | uVar15 | uVar13 | uVar14 | uVar17 | uVar20 | uVar21 |
       pDVar19->bits[7] << 0x1c;
  uVar10 = *(uint *)((long)pvVar3 + 0x240);
  uVar20 = pDVar19->bits[8] & 0xf;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xfffffff0 | uVar20;
  uVar21 = (pDVar19->bits[9] & 0xf) << 4;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xffffff00 | uVar20 | uVar21;
  uVar14 = (pDVar19->bits[10] & 0xf) << 8;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xfffff000 | uVar20 | uVar21 | uVar14;
  uVar17 = (pDVar19->bits[0xb] & 0xf) << 0xc;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xffff0000 | uVar20 | uVar21 | uVar14 | uVar17;
  uVar16 = (pDVar19->bits[0xc] & 0xf) << 0x10;
  *(uint *)((long)pvVar3 + 0x240) = uVar10 & 0xfff00000 | uVar20 | uVar21 | uVar14 | uVar17 | uVar16
  ;
  uVar15 = (pDVar19->bits[0xd] & 0xf) << 0x14;
  *(uint *)((long)pvVar3 + 0x240) =
       uVar10 & 0xff000000 | uVar20 | uVar21 | uVar14 | uVar17 | uVar16 | uVar15;
  uVar13 = (pDVar19->bits[0xe] & 0xf) << 0x18;
  *(uint *)((long)pvVar3 + 0x240) =
       uVar10 & 0xf0000000 | uVar20 | uVar21 | uVar14 | uVar17 | uVar16 | uVar15 | uVar13;
  *(uint *)((long)pvVar3 + 0x240) =
       uVar20 | uVar21 | uVar14 | uVar17 | uVar16 | uVar15 | uVar13 | pDVar19->bits[0xf] << 0x1c;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_write_code_word_number");
  }
  jpegd_write_qp_ac_dc_table(ctx,syntax);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_set_chroma_table_id");
  }
  pvVar3 = ctx->regs;
  if (syntax->ac_index[0] == 0) {
    uVar10 = *(uint *)((long)pvVar3 + 0x1e8);
    uVar16 = (syntax->ac_index[1] & 1) << 4;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar10 & 0xffffffef | uVar16;
    uVar10 = uVar10 & 0xffffffcf | uVar16 | (syntax->ac_index[2] & 1) << 5;
  }
  else {
    uVar16 = *(uint *)((long)pvVar3 + 0x1e8);
    uVar10 = (uint)(syntax->ac_index[0] != syntax->ac_index[1]) << 4;
    uVar15 = uVar10 | uVar16 & 0xffffffef;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar15;
    if (syntax->ac_index[0] == syntax->ac_index[2]) {
      uVar10 = uVar10 | uVar16 & 0xffffffcf;
    }
    else {
      uVar10 = uVar15 | 0x20;
    }
  }
  *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
  if (syntax->dc_index[0] == 0) {
    uVar10 = (uVar10 & 0xfffffffb) + (syntax->dc_index[1] & 1) * 4;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
    uVar10 = (uVar10 & 0xfffffff7) + (syntax->dc_index[2] & 1) * 8;
  }
  else {
    uVar10 = (uVar10 & 0xfffffffb) + (uint)(syntax->dc_index[0] != syntax->dc_index[1]) * 4;
    *(uint *)((long)pvVar3 + 0x1e8) = uVar10;
    if (syntax->dc_index[0] == syntax->dc_index[2]) {
      uVar10 = uVar10 & 0xfffffff7;
    }
    else {
      uVar10 = uVar10 | 8;
    }
  }
  *(uint *)((long)pvVar3 + 0x1e8) = uVar10 & 0xfffffffc;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_set_chroma_table_id");
  }
  iVar11 = mpp_buffer_get_fd_with_caller(ctx->pTableBase,"jpegd_gen_regs");
  *(int *)((long)__s + 0xf4) = iVar11;
  if (iVar11 == 0) {
    _mpp_log_l(2,"HAL_JPEG_VDPU2","get qtable_base failed\n","jpegd_gen_regs");
    return MPP_NOK;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_set_stream_offset");
  }
  pvVar3 = ctx->regs;
  uVar10 = syntax->strm_offset;
  *(RK_S32 *)((long)pvVar3 + 0x100) = ctx->pkt_fd;
  uVar10 = uVar10 & 0xfffffff8;
  if (uVar10 != 0) {
    mpp_dev_set_reg_offset(ctx->dev,0x40,uVar10);
  }
  uVar16 = *(uint *)((long)pvVar3 + 0x1e8) & 0x3ffffff | *(int *)&syntax->cur_pos << 0x1d;
  *(uint *)((long)pvVar3 + 0x1e8) = uVar16;
  *(RK_U32 *)((long)pvVar3 + 0xcc) =
       syntax->pkt_len - uVar10 & 0xffffff | (uint)*(byte *)((long)pvVar3 + 0xcf) << 0x18;
  *(uint *)((long)pvVar3 + 0x1e8) = uVar16 | 0x40;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_set_stream_offset");
  }
  if (syntax->restart_interval == 0) {
    *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) & 0xfdffffff;
  }
  else {
    *(uint *)((long)__s + 0x1e8) = *(uint *)((long)__s + 0x1e8) | 0x2000000;
    *(short *)((long)__s + 0x1ec) = (short)syntax->restart_interval;
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","jpegd_setup_pp");
  }
  puVar25 = (uint *)ctx->regs;
  bVar1 = (ctx->pp_info).pp_in_fmt;
  bVar6 = (ctx->pp_info).pp_out_fmt;
  RVar2 = (ctx->pp_info).dither_enable;
  uVar20 = (ctx->pp_info).crop_width;
  uVar17 = (ctx->pp_info).crop_height;
  uVar10 = (ctx->pp_info).crop_x;
  uVar16 = (ctx->pp_info).crop_y;
  uVar15 = syntax->hor_stride;
  uVar13 = syntax->ver_stride;
  *puVar25 = *puVar25 & 0xff0000c0 | 0x30;
  puVar25[0x12] = 0;
  uVar14 = puVar25[0x25];
  puVar25[0x25] = uVar14 | 0xb0f;
  puVar25[0x29] = puVar25[0x29] | 0x10010008;
  if (uVar20 == 0) {
    uVar21 = (uVar13 & 0xfffffff0) << 0x11 | uVar15 >> 4 & 0xfff;
    uVar17 = uVar13;
    uVar20 = uVar15;
  }
  else {
    uVar21 = (uVar17 & 0xfffffff0) << 0x11 | uVar20 >> 4 & 0xfff;
    puVar25[0xe] = (uint)((uVar20 & 0xf) != 0) << 0x1d | (uVar10 & 0xe000) << 0xb |
                   uVar10 >> 4 & 0x1ff | (uint)((uVar17 & 0xf) != 0) << 0x1c | uVar16 >> 3 & 0xe00 |
                   (uVar16 & 0xff0) << 0xc | puVar25[0xe] & 0xc800f000;
  }
  uVar23 = (ulong)bVar6;
  puVar25[0x22] = uVar21 | (uVar15 & 0x1ff0) << 8;
  *(ushort *)(puVar25 + 0x27) = (ushort)puVar25[0x27] & 0xf000 | (ushort)uVar15 & 0xfff;
  puVar25[0x23] = uVar13 << 0x10 & 0x7ff0000 | uVar15 & 0x7ff | puVar25[0x23] & 0xf800f800;
  if (6 < bVar1) {
    if (bVar1 == 7) {
      uVar10 = puVar25[0x26] & 0xfff8f8ff | 0x700;
LAB_0020dd92:
      puVar25[0x26] = uVar10;
      goto LAB_0020dd99;
    }
    if (bVar1 == 8) {
      uVar10 = puVar25[0x26] & 0xfff8f8ff | 0x10000;
      goto LAB_0020dd92;
    }
    pcVar18 = "unsupported format:%d";
    uVar23 = (ulong)(uint)bVar1;
LAB_0020e21e:
    _mpp_log_l(2,"HAL_JPEG_VDPU2",pcVar18,"jpegd_setup_pp",uVar23);
    goto LAB_0020e225;
  }
  uVar10 = puVar25[0x26] & 0xfffff8ff | (bVar1 & 7) << 8;
  puVar25[0x26] = uVar10;
LAB_0020dd99:
  uVar8 = (ushort)puVar25[0xf] & 0xe0e0;
  *(ushort *)(puVar25 + 0xf) = uVar8 + 0x909;
  *(undefined1 *)(puVar25 + 3) = 4;
  if (bVar6 < 2) {
    *(ushort *)(puVar25 + 0xf) = uVar8 | 0x929;
    *(undefined2 *)(puVar25 + 0x1f) = 0xa537;
    puVar25[0x20] = puVar25[0x20] & 0xfc00fc00;
    puVar25[0x25] = (uVar14 | 0xb0f) & 0xfffffff7;
    *(ulong *)(puVar25 + 1) = *(ulong *)(puVar25 + 1) & 0xc0000000c0000000 | (ulong)DAT_002a2450;
    pPVar12 = get_pp_rgb_Cfg(ctx->output_fmt);
    RVar26 = pPVar12->g_mask;
    puVar25[9] = pPVar12->r_mask;
    puVar25[10] = RVar26;
    puVar25[0xb] = pPVar12->b_mask;
    uVar10 = puVar25[0x10];
    uVar16 = pPVar12->r_padd & 0x1f;
    puVar25[0x10] = uVar10 & 0xffffffe0 | uVar16;
    uVar14 = (pPVar12->g_padd & 0x1f) << 8;
    puVar25[0x10] = uVar10 & 0xffffe0e0 | uVar16 | uVar14;
    puVar25[0x10] = uVar10 & 0xffe0e0e0 | uVar16 | uVar14 | (pPVar12->b_padd & 0x1f) << 0x10;
    if (RVar2 == '\0') {
      if ((char)jpegd_debug < '\0') {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","we do not dither.",(char *)0x0);
      }
    }
    else {
      if ((char)jpegd_debug < '\0') {
        _mpp_log_l(4,"HAL_JPEG_VDPU2","we do dither.",(char *)0x0);
      }
      bVar1 = (byte)puVar25[0x24];
      bVar6 = pPVar12->r_dither & 3;
      *(byte *)(puVar25 + 0x24) = bVar1 & 0xfc | bVar6;
      bVar7 = (pPVar12->g_dither & 3) << 2;
      *(byte *)(puVar25 + 0x24) = bVar1 & 0xf0 | bVar6 | bVar7;
      *(byte *)(puVar25 + 0x24) = bVar1 & 0xc0 | bVar6 | bVar7 | (pPVar12->b_dither & 3) << 4;
    }
    uVar10._0_1_ = pPVar12->rgb_in_32;
    uVar10._1_1_ = pPVar12->r_padd;
    uVar10._2_1_ = pPVar12->g_padd;
    uVar10._3_1_ = pPVar12->b_padd;
    uVar16 = puVar25[0x25];
    uVar10 = (uVar10 & 1) << 4;
    puVar25[0x25] = uVar16 & 0xffffffef | uVar10;
    uVar14 = (pPVar12->swap_16 & 1) << 10;
    puVar25[0x25] = uVar16 & 0xfffffbef | uVar10 | uVar14;
    uVar21 = (pPVar12->swap_32 & 1) << 0xb;
    puVar25[0x25] = uVar16 & 0xfffff3ef | uVar10 | uVar14 | uVar21;
    puVar25[0x25] = (uVar16 & 0xfffff3e7 | uVar10 | uVar14 | uVar21) + (pPVar12->out_endian & 1) * 8
    ;
    uVar10 = puVar25[0x26] & 0xffffc7ff;
  }
  else if (bVar6 == 5) {
    uVar10 = uVar10 & 0xffffc7ff | 0x2800;
  }
  else {
    if (bVar6 != 3) {
      pcVar18 = "unsuppotred format:%d";
      goto LAB_0020e21e;
    }
    uVar10 = uVar10 & 0xffffc7ff | 0x1800;
  }
  puVar25[0x26] = uVar10 & 0xfffffff8;
  uVar14 = uVar20 - 1;
  uVar21 = uVar17 - 1;
  uVar16 = uVar15 - 1;
  uVar10 = uVar13 - 1;
  if (uVar14 < uVar16) {
    uVar22 = (puVar25[4] & 0xfff00000) + ((uVar16 * 0x10000) / uVar14 & 0x3ffff) + 0x40000;
    uVar20 = uVar16;
LAB_0020e00a:
    *(short *)(puVar25 + 6) = (short)((uVar14 << 0x10) / uVar20);
  }
  else {
    uVar22 = puVar25[4] & 0xfff3ffff;
    if (uVar16 < uVar14) {
      uVar22 = uVar22 | 0x80000;
      uVar14 = uVar15;
      goto LAB_0020e00a;
    }
  }
  uVar22 = uVar22 & 0xffcfffff;
  if (uVar21 < uVar10) {
    puVar25[4] = uVar22 | 0x100000;
    puVar25[5] = puVar25[5] & 0xfffc0000 | (uVar10 * 0x10000) / uVar21 & 0x3ffff;
    uVar9 = (undefined2)((uVar21 * 0x10000) / uVar10);
LAB_0020e077:
    *(undefined2 *)((long)puVar25 + 0x1a) = uVar9;
  }
  else {
    if (uVar10 < uVar21) {
      puVar25[4] = uVar22 | 0x200000;
      uVar9 = (undefined2)(((uVar13 << 0x10) / uVar17) * 0x10000 + 0x10000 >> 0x10);
      goto LAB_0020e077;
    }
    puVar25[4] = uVar22;
  }
  uVar16._0_1_ = (ctx->pp_info).pp_enable;
  uVar16._1_1_ = (ctx->pp_info).pp_in_fmt;
  uVar16._2_1_ = (ctx->pp_info).pp_out_fmt;
  uVar16._3_1_ = (ctx->pp_info).dither_enable;
  uVar10 = puVar25[0x29] & 0xffffffef | (uVar16 & 1) << 4;
  puVar25[0x29] = uVar10;
  if ((jpegd_debug & 0x80) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","pp_enable %d\n",(char *)0x0,(ulong)(ctx->pp_info).pp_enable);
    uVar10 = puVar25[0x29];
  }
  RVar26 = uVar13 * uVar15;
  if ((ctx->pp_info).pp_enable == '\0') {
    *(byte *)(puVar25 + 0x39) = (byte)puVar25[0x39] & 0xfb;
    puVar25[0x29] = uVar10 & 0xffffffef;
    puVar25[0x15] = 0;
    puVar25[0x16] = 0;
    uVar10 = ctx->frame_fd;
    puVar25[0x3f] = uVar10;
    puVar25[0x83] = uVar10;
    if (RVar26 != 0) {
      mpp_dev_set_reg_offset(ctx->dev,0x83,RVar26);
    }
    if ((char)jpegd_debug < '\0') {
      puVar25 = puVar25 + 0x83;
      pcVar18 = "output_frame_fd:%x, reg131:%x";
      goto LAB_0020e19b;
    }
  }
  else {
    *(byte *)(puVar25 + 0x39) = (byte)puVar25[0x39] | 4;
    puVar25[0x29] = uVar10 | 0x10;
    puVar25[0x3f] = 0;
    puVar25[0x83] = 0;
    uVar10 = ctx->frame_fd;
    puVar25[0x15] = uVar10;
    puVar25[0x16] = uVar10;
    if (RVar26 != 0) {
      mpp_dev_set_reg_offset(ctx->dev,0x16,RVar26);
    }
    if ((char)jpegd_debug < '\0') {
      puVar25 = puVar25 + 0x16;
      pcVar18 = "output_frame_fd:%x, reg22:%x";
LAB_0020e19b:
      _mpp_log_l(4,"HAL_JPEG_VDPU2",pcVar18,(char *)0x0,(ulong)(uint)ctx->frame_fd,(ulong)*puVar25);
    }
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_setup_pp");
  }
LAB_0020e225:
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","jpegd_gen_regs");
  }
  return MPP_OK;
}

Assistant:

static
MPP_RET jpegd_gen_regs(JpegdHalCtx *ctx, JpegdSyntax *syntax)
{
    MPP_RET ret = MPP_OK;
    jpegd_dbg_func("enter\n");
    JpegdIocRegInfo *info = (JpegdIocRegInfo *)ctx->regs;
    JpegRegSet *reg = &(info->regs);
    JpegdSyntax *s = syntax;

    jpegd_regs_init(reg);

    reg->reg50_dec_ctrl.sw_filtering_dis = 1;
    reg->reg53_dec_mode = DEC_MODE_JPEG;

    reg->reg57_enable_ctrl.sw_dec_e = 1;  /* Enable jpeg mode */
    reg->reg57_enable_ctrl.sw_pjpeg_e = 0;
    reg->reg57_enable_ctrl.sw_dec_out_dis = 0;
    reg->reg57_enable_ctrl.sw_rlc_mode_e = 0;

    /* frame size, round up the number of mbs */
    reg->reg120.sw_pic_mb_h_ext = ((((s->ver_stride) >> (4)) & 0x700) >> 8);
    reg->reg120.sw_pic_mb_w_ext = ((((s->hor_stride) >> (4)) & 0xE00) >> 9);
    reg->reg120.sw_pic_mb_width = ((s->hor_stride) >> (4)) & 0x1FF;
    reg->reg120.sw_pic_mb_hight_p = ((s->ver_stride) >> (4)) & 0x0FF;

    reg->reg121.sw_pjpeg_fildown_e = s->fill_bottom;
    /* Set spectral selection start coefficient */
    reg->reg121.sw_pjpeg_ss = s->scan_start;
    /* Set spectral selection end coefficient */
    reg->reg121.sw_pjpeg_se = s->scan_end;
    /* Set the point transform used in the preceding scan */
    reg->reg121.sw_pjpeg_ah = s->prev_shift;
    /* Set the point transform value */
    reg->reg121.sw_pjpeg_al = s->point_transform;

    reg->reg122.sw_jpeg_qtables = s->qtable_cnt;
    reg->reg122.sw_jpeg_mode = s->yuv_mode;
    reg->reg122.sw_jpeg_filright_e = s->fill_right;

    reg->reg148.sw_slice_h = 0;
    /* Set bit 21 of reg148 to 1, notifying hardware to decode jpeg
     * including DRI segment
     */
    reg->reg148.sw_syn_marker_e = 1;

    /* tell hardware that height is 8-pixel aligned,
     * but not 16-pixel aligned
     */
    if ((s->height % 16) && ((s->height % 16) <= 8) &&
        (!ctx->pp_info.pp_enable) &&
        (s->yuv_mode == JPEGDEC_YUV422 ||
         s->yuv_mode == JPEGDEC_YUV444 ||
         s->yuv_mode == JPEGDEC_YUV411)) {
        reg->reg148.sw_jpeg_height8_flag = 1;
    }

    /* write VLC code word number to register */
    jpegd_write_code_word_number(ctx, s);

    /* Create AC/DC/QP tables for hardware */
    jpegd_write_qp_ac_dc_table(ctx, s);

    /* Select which tables the chromas use */
    jpegd_set_chroma_table_id(ctx, s);

    /* write table base */
    reg->reg61_qtable_base = mpp_buffer_get_fd(ctx->pTableBase);
    if (reg->reg61_qtable_base <= 0) {
        mpp_err_f("get qtable_base failed\n");
        return MPP_NOK;
    }
    /* set up stream position for HW decode */
    jpegd_set_stream_offset(ctx, s);

    /* set restart interval */
    if (s->restart_interval) {
        reg->reg122.sw_sync_marker_e = 1;
        /* If exists DRI segment, bit 0 to bit 15 of reg123 is set
         * to restart interval */
        reg->reg123.sw_pjpeg_rest_freq = s->restart_interval;
    } else {
        reg->reg122.sw_sync_marker_e = 0;
    }

    jpegd_setup_pp(ctx, syntax);

    jpegd_dbg_func("exit\n");
    return ret;
}